

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_45f9e8::StoreResult<cmValue>
               (OutType infoType,cmMakefile *makefile,string *variable,cmValue value)

{
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  undefined1 extraout_AL_01;
  char *pcVar1;
  string_view value_00;
  
  if (infoType == OutSet) {
    pcVar1 = "1";
    if (value.Value == (string *)0x0) {
      pcVar1 = "0";
    }
    value_00._M_str = pcVar1;
    value_00._M_len = 1;
    cmMakefile::AddDefinition(makefile,variable,value_00);
    return (bool)extraout_AL;
  }
  if (value.Value != (string *)0x0) {
    cmMakefile::AddDefinition(makefile,variable,value);
    return (bool)extraout_AL_00;
  }
  cmMakefile::RemoveDefinition(makefile,variable);
  return (bool)extraout_AL_01;
}

Assistant:

bool StoreResult(OutType infoType, cmMakefile& makefile,
                 const std::string& variable, ValueType value)
{
  if (infoType == OutSet) {
    makefile.AddDefinition(variable, value ? "1" : "0");
  } else // if(infoType == OutValue)
  {
    if (value) {
      makefile.AddDefinition(variable, value);
    } else {
      makefile.RemoveDefinition(variable);
    }
  }
  return true;
}